

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

int hex_char_to_int(char c)

{
  int iVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  if ((byte)(c - 0x30U) < 10) {
    return iVar2 + -0x30;
  }
  if ((byte)(c + 0x9fU) < 6) {
    return iVar2 + -0x57;
  }
  iVar1 = -1;
  if ((byte)(c + 0xbfU) < 6) {
    iVar1 = iVar2 + -0x37;
  }
  return iVar1;
}

Assistant:

static int hex_char_to_int(char c) {
    if (c >= '0' && c <= '9') {
        return c - '0';
    } else if (c >= 'a' && c <= 'f') {
        return c - 'a' + 10;
    } else if (c >= 'A' && c <= 'F') {
        return c - 'A' + 10;
    }
    return -1;
}